

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::usdc::USDCReader::Impl::ReadUSDC(Impl *this)

{
  bool bVar1;
  CrateReader *pCVar2;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  size_t local_b8;
  size_t sz_mb;
  CrateReaderConfig config;
  Impl *this_local;
  
  config.maxMemoryBudget = (size_t)this;
  if ((this->crate_reader != (CrateReader *)0x0) &&
     (pCVar2 = this->crate_reader, pCVar2 != (CrateReader *)0x0)) {
    crate::CrateReader::~CrateReader(pCVar2);
    operator_delete(pCVar2,0x270);
  }
  crate::CrateReaderConfig::CrateReaderConfig((CrateReaderConfig *)&sz_mb);
  sz_mb._0_4_ = (this->_config).numThreads;
  local_b8 = (this->_config).kMaxAllowedMemoryInMB;
  config.maxInts = (this->_config).kMaxAllowedMemoryInMB << 0x14;
  pCVar2 = (CrateReader *)operator_new(0x270);
  crate::CrateReader::CrateReader(pCVar2,this->_sr,(CrateReaderConfig *)&sz_mb);
  this->crate_reader = pCVar2;
  ::std::__cxx11::string::clear();
  ::std::__cxx11::string::clear();
  bVar1 = crate::CrateReader::ReadBootStrap(this->crate_reader);
  if (bVar1) {
    bVar1 = crate::CrateReader::ReadTOC(this->crate_reader);
    if (bVar1) {
      bVar1 = crate::CrateReader::ReadTokens(this->crate_reader);
      if (bVar1) {
        bVar1 = crate::CrateReader::ReadStrings(this->crate_reader);
        if (bVar1) {
          bVar1 = crate::CrateReader::ReadFields(this->crate_reader);
          if (bVar1) {
            bVar1 = crate::CrateReader::ReadFieldSets(this->crate_reader);
            if (bVar1) {
              bVar1 = crate::CrateReader::ReadPaths(this->crate_reader);
              if (bVar1) {
                bVar1 = crate::CrateReader::ReadSpecs(this->crate_reader);
                if (bVar1) {
                  bVar1 = crate::CrateReader::BuildLiveFieldSets(this->crate_reader);
                  if (bVar1) {
                    crate::CrateReader::GetWarning_abi_cxx11_(&local_318,this->crate_reader);
                    ::std::__cxx11::string::operator+=((string *)&this->_warn,(string *)&local_318);
                    ::std::__cxx11::string::~string((string *)&local_318);
                    crate::CrateReader::GetError_abi_cxx11_(&local_338,this->crate_reader);
                    ::std::__cxx11::string::operator+=((string *)&this->_err,(string *)&local_338);
                    ::std::__cxx11::string::~string((string *)&local_338);
                    this_local._7_1_ = true;
                  }
                  else {
                    crate::CrateReader::GetWarning_abi_cxx11_(&local_2d8,this->crate_reader);
                    ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_2d8);
                    ::std::__cxx11::string::~string((string *)&local_2d8);
                    crate::CrateReader::GetError_abi_cxx11_(&local_2f8,this->crate_reader);
                    ::std::__cxx11::string::operator=((string *)&this->_err,(string *)&local_2f8);
                    ::std::__cxx11::string::~string((string *)&local_2f8);
                    this_local._7_1_ = false;
                  }
                }
                else {
                  crate::CrateReader::GetWarning_abi_cxx11_(&local_298,this->crate_reader);
                  ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_298);
                  ::std::__cxx11::string::~string((string *)&local_298);
                  crate::CrateReader::GetError_abi_cxx11_(&local_2b8,this->crate_reader);
                  ::std::__cxx11::string::operator=((string *)&this->_err,(string *)&local_2b8);
                  ::std::__cxx11::string::~string((string *)&local_2b8);
                  this_local._7_1_ = false;
                }
              }
              else {
                crate::CrateReader::GetWarning_abi_cxx11_(&local_258,this->crate_reader);
                ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_258);
                ::std::__cxx11::string::~string((string *)&local_258);
                crate::CrateReader::GetError_abi_cxx11_(&local_278,this->crate_reader);
                ::std::__cxx11::string::operator=((string *)&this->_err,(string *)&local_278);
                ::std::__cxx11::string::~string((string *)&local_278);
                this_local._7_1_ = false;
              }
            }
            else {
              crate::CrateReader::GetWarning_abi_cxx11_(&local_218,this->crate_reader);
              ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_218);
              ::std::__cxx11::string::~string((string *)&local_218);
              crate::CrateReader::GetError_abi_cxx11_(&local_238,this->crate_reader);
              ::std::__cxx11::string::operator=((string *)&this->_err,(string *)&local_238);
              ::std::__cxx11::string::~string((string *)&local_238);
              this_local._7_1_ = false;
            }
          }
          else {
            crate::CrateReader::GetWarning_abi_cxx11_(&local_1d8,this->crate_reader);
            ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_1d8);
            ::std::__cxx11::string::~string((string *)&local_1d8);
            crate::CrateReader::GetError_abi_cxx11_(&local_1f8,this->crate_reader);
            ::std::__cxx11::string::operator=((string *)&this->_err,(string *)&local_1f8);
            ::std::__cxx11::string::~string((string *)&local_1f8);
            this_local._7_1_ = false;
          }
        }
        else {
          crate::CrateReader::GetWarning_abi_cxx11_(&local_198,this->crate_reader);
          ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_198);
          ::std::__cxx11::string::~string((string *)&local_198);
          crate::CrateReader::GetError_abi_cxx11_(&local_1b8,this->crate_reader);
          ::std::__cxx11::string::operator=((string *)&this->_err,(string *)&local_1b8);
          ::std::__cxx11::string::~string((string *)&local_1b8);
          this_local._7_1_ = false;
        }
      }
      else {
        crate::CrateReader::GetWarning_abi_cxx11_(&local_158,this->crate_reader);
        ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_158);
        ::std::__cxx11::string::~string((string *)&local_158);
        crate::CrateReader::GetError_abi_cxx11_(&local_178,this->crate_reader);
        ::std::__cxx11::string::operator=((string *)&this->_err,(string *)&local_178);
        ::std::__cxx11::string::~string((string *)&local_178);
        this_local._7_1_ = false;
      }
    }
    else {
      crate::CrateReader::GetWarning_abi_cxx11_(&local_118,this->crate_reader);
      ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_118);
      ::std::__cxx11::string::~string((string *)&local_118);
      crate::CrateReader::GetError_abi_cxx11_(&local_138,this->crate_reader);
      ::std::__cxx11::string::operator=((string *)&this->_err,(string *)&local_138);
      ::std::__cxx11::string::~string((string *)&local_138);
      this_local._7_1_ = false;
    }
  }
  else {
    crate::CrateReader::GetWarning_abi_cxx11_(&local_d8,this->crate_reader);
    ::std::__cxx11::string::operator=((string *)&this->_warn,(string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    crate::CrateReader::GetError_abi_cxx11_(&local_f8,this->crate_reader);
    ::std::__cxx11::string::operator=((string *)&this->_err,(string *)&local_f8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool USDCReader::Impl::ReadUSDC() {
  if (crate_reader) {
    delete crate_reader;
  }

  // TODO: Setup CrateReaderConfig.
  crate::CrateReaderConfig config;

  // Transfer settings
  config.numThreads = _config.numThreads;

  size_t sz_mb = _config.kMaxAllowedMemoryInMB;
  if (sizeof(size_t) == 4) {
    // 32bit
    // cap to 2GB
    sz_mb = (std::min)(size_t(1024 * 2), sz_mb);

    config.maxMemoryBudget = sz_mb * 1024 * 1024;
  } else {
    config.maxMemoryBudget = _config.kMaxAllowedMemoryInMB * 1024ull * 1024ull;
  }

  crate_reader = new crate::CrateReader(_sr, config);

  _warn.clear();
  _err.clear();

  if (!crate_reader->ReadBootStrap()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadTOC()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  // Read known sections

  if (!crate_reader->ReadTokens()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadStrings()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadFields()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadFieldSets()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadPaths()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  if (!crate_reader->ReadSpecs()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();
    return false;
  }

  // TODO(syoyo): Read unknown sections

  ///
  /// Reconstruct C++ representation of USD scene graph.
  ///
  DCOUT("BuildLiveFieldSets");
  if (!crate_reader->BuildLiveFieldSets()) {
    _warn = crate_reader->GetWarning();
    _err = crate_reader->GetError();

    return false;
  }

  _warn += crate_reader->GetWarning();
  _err += crate_reader->GetError();

  DCOUT("Read Crate.");

  return true;
}